

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControl::findNextPrevAnchor
          (QWidgetTextControl *this,QTextCursor *startCursor,bool next,QTextCursor *newAnchor)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MoveMode MVar8;
  int iVar9;
  MoveMode MVar10;
  MoveMode MVar11;
  undefined7 in_register_00000011;
  storage_type_conflict *psVar12;
  storage_type_conflict *psVar13;
  undefined1 auVar14 [8];
  long in_FS_OFFSET;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QArrayData *local_110;
  QArrayData *local_108;
  storage_type_conflict *local_f8;
  undefined1 *local_f0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QArrayData *local_b8;
  storage_type_conflict *psStack_b0;
  long local_a8;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((int)CONCAT71(in_register_00000011,next) == 0) {
    iVar6 = QTextCursor::selectionStart();
    iVar6 = iVar6 - (uint)(0 < iVar6);
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_90 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::end();
    iVar7 = QTextBlock::position();
    if (iVar6 == iVar7) {
      QTextBlock::begin();
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_a8);
      local_98 = (undefined1  [8])local_b8;
      uStack_90 = psStack_b0;
    }
    else {
      do {
        if (local_98 == (undefined1  [8])local_58._0_8_) {
          if ((int)local_88 != (int)local_48) goto LAB_004c7c28;
          local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
          local_98 = (undefined1  [8])0x0;
          uStack_90 = (storage_type_conflict *)0x0;
          local_68 = (QArrayData *)0x0;
          puStack_60 = (undefined1 *)((ulong)puStack_60 & 0xffffffff00000000);
        }
        else {
LAB_004c7c28:
          QTextBlock::iterator::operator--((iterator *)local_98);
        }
        if ((int)local_88 == uStack_90._4_4_) break;
        QTextBlock::iterator::fragment();
        iVar7 = QTextFragment::position();
        QTextBlock::iterator::fragment();
        iVar9 = QTextFragment::length();
      } while (iVar6 < iVar9 + iVar7 + -1);
    }
    cVar4 = QTextBlock::isValid();
    if (cVar4 != '\0') {
      local_110 = (QArrayData *)0x0;
      local_f8 = (storage_type_conflict *)0x0;
      local_f0 = (undefined1 *)0x0;
      do {
        MVar8 = ~MoveAnchor;
        while ((int)local_88 != uStack_90._4_4_) {
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFragment::charFormat();
          iVar6 = (int)(QTextFormat *)&local_c8;
          cVar4 = QTextFormat::boolProperty(iVar6);
          if ((cVar4 != '\0') && (cVar4 = QTextFormat::hasProperty(iVar6), cVar4 != '\0')) {
            iVar6 = QTextFragment::position();
            iVar7 = QTextFragment::length();
            QTextFormat::stringProperty((int)&local_b8);
            lVar2 = local_a8;
            psVar12 = psStack_b0;
            auVar14 = (undefined1  [8])local_b8;
            local_b8 = local_110;
            psStack_b0 = local_f8;
            local_a8 = (long)local_f0;
            if (local_110 != (QArrayData *)0x0) {
              LOCK();
              (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_110,2,0x10);
              }
            }
            MVar8 = iVar7 + iVar6;
            QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
            if (MVar8 == ~MoveAnchor) {
              local_110 = (QArrayData *)auVar14;
              local_f8 = psVar12;
              local_f0 = (undefined1 *)lVar2;
              MVar8 = ~MoveAnchor;
            }
            else {
              if ((int)local_88 != uStack_90._4_4_) {
                goto LAB_004c810d;
              }
              local_110 = (QArrayData *)auVar14;
              local_f8 = psVar12;
              local_f0 = (undefined1 *)lVar2;
            }
            break;
          }
          if (local_98 == (undefined1  [8])local_58._0_8_) {
            if ((int)local_88 != (int)local_48) goto LAB_004c7d6e;
            local_98 = (undefined1  [8])0x0;
            uStack_90 = (storage_type_conflict *)0x0;
            local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
          }
          else {
LAB_004c7d6e:
            QTextBlock::iterator::operator--((iterator *)local_98);
          }
          QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
        }
        QTextBlock::previous();
        local_68 = local_b8;
        puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,psStack_b0._0_4_);
        QTextBlock::end();
        local_88 = (undefined1 *)CONCAT44(local_88._4_4_,(int)local_a8);
        local_98 = (undefined1  [8])local_b8;
        uStack_90 = psStack_b0;
        QTextBlock::begin();
        if (local_98 == (undefined1  [8])local_b8) {
          if ((int)local_88 != (int)local_a8) goto LAB_004c7ee7;
        }
        else {
LAB_004c7ee7:
          QTextBlock::iterator::operator--((iterator *)local_98);
        }
        QTextBlock::begin();
        local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_a8);
        local_58._0_8_ = local_b8;
        stack0xffffffffffffffb0 = psStack_b0;
        cVar4 = QTextBlock::isValid();
      } while (cVar4 != '\0');
      auVar14 = (undefined1  [8])local_110;
      MVar11 = ~MoveAnchor;
      goto LAB_004c7f40;
    }
    local_108 = (QArrayData *)0x0;
  }
  else {
    iVar6 = QTextCursor::selectionEnd();
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_b0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_b8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    if ((int)local_48 != iStack_4c) {
      do {
        QTextBlock::iterator::fragment();
        iVar7 = QTextFragment::position();
        if (iVar6 <= iVar7) break;
        QTextBlock::iterator::operator++((iterator *)local_58);
      } while ((int)local_48 != iStack_4c);
    }
    cVar4 = QTextBlock::isValid();
    if (cVar4 == '\0') {
      MVar8 = ~MoveAnchor;
      auVar14 = (undefined1  [8])(QArrayData *)0x0;
      MVar11 = ~MoveAnchor;
      goto LAB_004c7f40;
    }
    local_108 = (QArrayData *)0x0;
    local_f0 = (undefined1 *)0x0;
    psVar12 = (storage_type_conflict *)0x0;
LAB_004c7980:
    do {
      psVar13 = psVar12;
      if ((int)local_48 != iStack_4c) {
        local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QTextFragment::charFormat();
        iVar6 = (int)(QTextFormat *)&local_78;
        cVar4 = QTextFormat::boolProperty(iVar6);
        if ((cVar4 == '\0') || (cVar4 = QTextFormat::hasProperty(iVar6), cVar4 == '\0')) {
          QTextFormat::~QTextFormat((QTextFormat *)&local_78);
          QTextBlock::iterator::operator++((iterator *)local_58);
          goto LAB_004c7980;
        }
        MVar8 = QTextFragment::position();
        QTextFormat::stringProperty((int)local_98);
        puVar3 = local_88;
        psVar13 = uStack_90;
        auVar14 = local_98;
        local_98 = (undefined1  [8])local_108;
        local_88 = local_f0;
        uStack_90 = psVar12;
        if (local_108 != (QArrayData *)0x0) {
          LOCK();
          (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_108,2,0x10);
          }
        }
        QTextFormat::~QTextFormat((QTextFormat *)&local_78);
        if (MVar8 != ~MoveAnchor) {
          if ((int)local_48 == iStack_4c) goto LAB_004c8280;
          goto LAB_004c800a;
        }
        local_108 = (QArrayData *)auVar14;
        local_f0 = puVar3;
      }
      QTextBlock::next();
      local_b8 = (QArrayData *)local_98;
      psStack_b0 = (storage_type_conflict *)CONCAT44(psStack_b0._4_4_,(int)uStack_90);
      QTextBlock::begin();
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_88);
      local_58._0_8_ = local_98;
      stack0xffffffffffffffb0 = uStack_90;
      cVar4 = QTextBlock::isValid();
      psVar12 = psVar13;
    } while (cVar4 != '\0');
  }
  MVar8 = ~MoveAnchor;
  auVar14 = (undefined1  [8])local_108;
  MVar11 = ~MoveAnchor;
  goto LAB_004c7f40;
LAB_004c810d:
  do {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFragment::charFormat();
    cVar4 = QTextFormat::boolProperty((int)(QTextFormat *)&local_c8);
    if (cVar4 == '\0') {
LAB_004c8215:
      iVar6 = QTextFragment::position();
      iVar7 = QTextFragment::length();
      QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
      MVar11 = iVar7 + iVar6;
      if (iVar7 + iVar6 != ~MoveAnchor) goto LAB_004c7f40;
      break;
    }
    QTextFormat::stringProperty((int)&local_b8);
    bVar5 = 1;
    if (local_a8 == lVar2) {
      QVar16.m_data = psStack_b0;
      QVar16.m_size = lVar2;
      QVar18.m_data = psVar12;
      QVar18.m_size = lVar2;
      bVar5 = QtPrivate::equalStrings(QVar16,QVar18);
      bVar5 = bVar5 ^ 1;
    }
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    if (bVar5 != 0) goto LAB_004c8215;
    if (local_98 == (undefined1  [8])local_58._0_8_) {
      if ((int)local_88 != (int)local_48) goto LAB_004c81ef;
      local_98 = (undefined1  [8])0x0;
      uStack_90 = (storage_type_conflict *)0x0;
      local_88 = (undefined1 *)((ulong)local_88 & 0xffffffff00000000);
    }
    else {
LAB_004c81ef:
      QTextBlock::iterator::operator--((iterator *)local_98);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  } while ((int)local_88 != uStack_90._4_4_);
  MVar10 = QTextBlock::position();
  MVar11 = MoveAnchor;
  if (0 < (int)MVar10) {
    MVar11 = MVar10;
  }
  goto LAB_004c7f40;
  while( true ) {
    QTextFormat::stringProperty((int)local_98);
    bVar5 = 1;
    if (local_88 == puVar3) {
      QVar15.m_data = uStack_90;
      QVar15.m_size = (qsizetype)puVar3;
      QVar17.m_data = psVar13;
      QVar17.m_size = (qsizetype)puVar3;
      bVar5 = QtPrivate::equalStrings(QVar15,QVar17);
      bVar5 = bVar5 ^ 1;
    }
    if (local_98 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98,2,0x10);
      }
    }
    if (bVar5 != 0) goto LAB_004c825d;
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
    QTextBlock::iterator::operator++((iterator *)local_58);
    if ((int)local_48 == iStack_4c) break;
LAB_004c800a:
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFragment::charFormat();
    cVar4 = QTextFormat::boolProperty((int)(QTextFormat *)&local_78);
    if (cVar4 == '\0') {
LAB_004c825d:
      MVar11 = QTextFragment::position();
      QTextFormat::~QTextFormat((QTextFormat *)&local_78);
      if (MVar11 != ~MoveAnchor) goto LAB_004c7f40;
      break;
    }
  }
LAB_004c8280:
  iVar6 = QTextBlock::position();
  iVar7 = QTextBlock::length();
  MVar11 = (iVar6 + iVar7) - KeepAnchor;
LAB_004c7f40:
  if (MVar11 != ~MoveAnchor && MVar8 != ~MoveAnchor) {
    QTextCursor::operator=(newAnchor,(QTextCursor *)(lVar1 + 0x88));
    QTextCursor::setPosition((int)newAnchor,MVar8);
    QTextCursor::setPosition((int)newAnchor,MVar11);
  }
  if (auVar14 != (undefined1  [8])0x0) {
    LOCK();
    (((QArrayData *)auVar14)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)auVar14)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)auVar14)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auVar14,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return MVar11 != ~MoveAnchor && MVar8 != ~MoveAnchor;
}

Assistant:

bool QWidgetTextControl::findNextPrevAnchor(const QTextCursor &startCursor, bool next, QTextCursor &newAnchor)
{
    Q_D(QWidgetTextControl);

    int anchorStart = -1;
    QString anchorHref;
    int anchorEnd = -1;

    if (next) {
        const int startPos = startCursor.selectionEnd();

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator it = block.begin();

        while (!it.atEnd() && it.fragment().position() < startPos)
            ++it;

        while (block.isValid()) {
            anchorStart = -1;

            // find next anchor
            for (; !it.atEnd(); ++it) {
                const QTextFragment fragment = it.fragment();
                const QTextCharFormat fmt = fragment.charFormat();

                if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                    anchorStart = fragment.position();
                    anchorHref = fmt.anchorHref();
                    break;
                }
            }

            if (anchorStart != -1) {
                anchorEnd = -1;

                // find next non-anchor fragment
                for (; !it.atEnd(); ++it) {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position();
                        break;
                    }
                }

                if (anchorEnd == -1)
                    anchorEnd = block.position() + block.length() - 1;

                // make found selection
                break;
            }

            block = block.next();
            it = block.begin();
        }
    } else {
        int startPos = startCursor.selectionStart();
        if (startPos > 0)
            --startPos;

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator blockStart = block.begin();
        QTextBlock::Iterator it = block.end();

        if (startPos == block.position()) {
            it = block.begin();
        } else {
            do {
                if (it == blockStart) {
                    it = QTextBlock::Iterator();
                    block = QTextBlock();
                } else {
                    --it;
                }
            } while (!it.atEnd() && it.fragment().position() + it.fragment().length() - 1 > startPos);
        }

        while (block.isValid()) {
            anchorStart = -1;

            if (!it.atEnd()) {
                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                        anchorStart = fragment.position() + fragment.length();
                        anchorHref = fmt.anchorHref();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());
            }

            if (anchorStart != -1 && !it.atEnd()) {
                anchorEnd = -1;

                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position() + fragment.length();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());

                if (anchorEnd == -1)
                    anchorEnd = qMax(0, block.position());

                break;
            }

            block = block.previous();
            it = block.end();
            if (it != block.begin())
                --it;
            blockStart = block.begin();
        }

    }

    if (anchorStart != -1 && anchorEnd != -1) {
        newAnchor = d->cursor;
        newAnchor.setPosition(anchorStart);
        newAnchor.setPosition(anchorEnd, QTextCursor::KeepAnchor);
        return true;
    }

    return false;
}